

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_firedemon.cpp
# Opt level: O2

int AF_A_FiredSplotch(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  int iVar3;
  AActor *pAVar4;
  DObject *this_00;
  char *__assertion;
  FName local_40;
  FName local_3c;
  DVector3 local_38;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053abbf;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (DObject *)0x0) {
LAB_0053a9d3:
        this_00 = (DObject *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053abbf;
        }
      }
      if (numparam == 1) goto LAB_0053aa53;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0053abaf;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053abbf;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053abaf;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053aa53:
        FName::FName(&local_3c,"FireDemonSplotch1");
        local_38.X = *(double *)&this_00[1].ObjectFlags;
        local_38.Y = (double)this_00[2]._vptr_DObject;
        local_38.Z = (double)this_00[2].Class;
        pAVar4 = Spawn(&local_3c,&local_38,ALLOW_REPLACE);
        if (pAVar4 != (AActor *)0x0) {
          iVar3 = FRandom::operator()(&pr_firedemonsplotch);
          (pAVar4->Vel).X = (double)(iVar3 + -0x80) * 0.03125;
          iVar3 = FRandom::operator()(&pr_firedemonsplotch);
          (pAVar4->Vel).Y = (double)(iVar3 + -0x80) * 0.03125;
          iVar3 = FRandom::operator()(&pr_firedemonsplotch);
          (pAVar4->Vel).Z = (double)iVar3 * 0.015625 + 3.0;
        }
        FName::FName(&local_40,"FireDemonSplotch2");
        local_38.X = *(double *)&this_00[1].ObjectFlags;
        local_38.Y = (double)this_00[2]._vptr_DObject;
        local_38.Z = (double)this_00[2].Class;
        pAVar4 = Spawn(&local_40,&local_38,ALLOW_REPLACE);
        if (pAVar4 != (AActor *)0x0) {
          iVar3 = FRandom::operator()(&pr_firedemonsplotch);
          (pAVar4->Vel).X = (double)(iVar3 + -0x80) * 0.03125;
          iVar3 = FRandom::operator()(&pr_firedemonsplotch);
          (pAVar4->Vel).Y = (double)(iVar3 + -0x80) * 0.03125;
          iVar3 = FRandom::operator()(&pr_firedemonsplotch);
          (pAVar4->Vel).Z = (double)iVar3 * 0.015625 + 3.0;
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053abbf;
    }
    if (this_00 == (DObject *)0x0) goto LAB_0053a9d3;
  }
LAB_0053abaf:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053abbf:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                ,0xe5,"int AF_A_FiredSplotch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FiredSplotch)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;

	mo = Spawn ("FireDemonSplotch1", self->Pos(), ALLOW_REPLACE);
	if (mo)
	{
		mo->Vel.X = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Y = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Z = (pr_firedemonsplotch() / 64.) + 3;
	}
	mo = Spawn ("FireDemonSplotch2", self->Pos(), ALLOW_REPLACE);
	if (mo)
	{
		mo->Vel.X = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Y = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Z = (pr_firedemonsplotch() / 64.) + 3;
	}
	return 0;
}